

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,int kernel_width)

{
  int iVar1;
  uint local_38;
  uint local_34;
  uint total;
  int i;
  int j;
  int safe_h;
  uchar buffer [8];
  int kernel_width_local;
  int stride_in_bytes_local;
  int h_local;
  int w_local;
  uchar *pixels_local;
  
  iVar1 = h - kernel_width;
  total = 0;
  buffer._0_4_ = kernel_width;
  buffer._4_4_ = stride_in_bytes;
  _h_local = pixels;
  do {
    if (w <= (int)total) {
      return;
    }
    nk_memset(&j,0,(long)(int)buffer._0_4_);
    local_38 = 0;
    switch(buffer._0_4_) {
    case 2:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)(local_34 * buffer._4_4_)] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (long)(int)(local_34 + buffer._0_4_ & 7)) =
             _h_local[(int)(local_34 * buffer._4_4_)];
        _h_local[(int)(local_34 * buffer._4_4_)] = (uchar)(local_38 >> 1);
      }
      break;
    case 3:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)(local_34 * buffer._4_4_)] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (long)(int)(local_34 + buffer._0_4_ & 7)) =
             _h_local[(int)(local_34 * buffer._4_4_)];
        _h_local[(int)(local_34 * buffer._4_4_)] = (uchar)((ulong)local_38 / 3);
      }
      break;
    case 4:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)(local_34 * buffer._4_4_)] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (long)(int)(local_34 + buffer._0_4_ & 7)) =
             _h_local[(int)(local_34 * buffer._4_4_)];
        _h_local[(int)(local_34 * buffer._4_4_)] = (uchar)(local_38 >> 2);
      }
      break;
    case 5:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)(local_34 * buffer._4_4_)] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (long)(int)(local_34 + buffer._0_4_ & 7)) =
             _h_local[(int)(local_34 * buffer._4_4_)];
        _h_local[(int)(local_34 * buffer._4_4_)] = (uchar)((ulong)local_38 / 5);
      }
      break;
    default:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)(local_34 * buffer._4_4_)] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (long)(int)(local_34 + buffer._0_4_ & 7)) =
             _h_local[(int)(local_34 * buffer._4_4_)];
        _h_local[(int)(local_34 * buffer._4_4_)] = (uchar)(local_38 / (uint)buffer._0_4_);
      }
    }
    for (; (int)local_34 < h; local_34 = local_34 + 1) {
      if (_h_local[(int)(local_34 * buffer._4_4_)] != '\0') {
        __assert_fail("pixels[i*stride_in_bytes] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x3087,"void nk_tt__v_prefilter(unsigned char *, int, int, int, int)");
      }
      local_38 = local_38 - *(byte *)((long)&j + (long)(int)(local_34 & 7));
      _h_local[(int)(local_34 * buffer._4_4_)] = (uchar)(local_38 / (uint)buffer._0_4_);
    }
    _h_local = _h_local + 1;
    total = total + 1;
  } while( true );
}

Assistant:

NK_INTERN void
nk_tt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes,
    int kernel_width)
{
    unsigned char buffer[NK_TT_MAX_OVERSAMPLE];
    int safe_h = h - kernel_width;
    int j;

    for (j=0; j < w; ++j)
    {
        int i;
        unsigned int total;
        NK_MEMSET(buffer, 0, (nk_size)kernel_width);

        total = 0;

        /* make kernel_width a constant in common cases so compiler can optimize out the divide */
        switch (kernel_width) {
        case 2:
            for (i=0; i <= safe_h; ++i) {
                total += (unsigned int)(pixels[i*stride_in_bytes] - buffer[i & NK_TT__OVER_MASK]);
                buffer[(i+kernel_width) & NK_TT__OVER_MASK] = pixels[i*stride_in_bytes];
                pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
            }
            break;
         case 3:
            for (i=0; i <= safe_h; ++i) {
                total += (unsigned int)(pixels[i*stride_in_bytes] - buffer[i & NK_TT__OVER_MASK]);
                buffer[(i+kernel_width) & NK_TT__OVER_MASK] = pixels[i*stride_in_bytes];
                pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
            }
            break;
         case 4:
            for (i=0; i <= safe_h; ++i) {
                total += (unsigned int)(pixels[i*stride_in_bytes] - buffer[i & NK_TT__OVER_MASK]);
                buffer[(i+kernel_width) & NK_TT__OVER_MASK] = pixels[i*stride_in_bytes];
                pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
            }
            break;
         case 5:
            for (i=0; i <= safe_h; ++i) {
                total += (unsigned int)(pixels[i*stride_in_bytes] - buffer[i & NK_TT__OVER_MASK]);
                buffer[(i+kernel_width) & NK_TT__OVER_MASK] = pixels[i*stride_in_bytes];
                pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
            }
            break;
         default:
            for (i=0; i <= safe_h; ++i) {
                total += (unsigned int)(pixels[i*stride_in_bytes] - buffer[i & NK_TT__OVER_MASK]);
                buffer[(i+kernel_width) & NK_TT__OVER_MASK] = pixels[i*stride_in_bytes];
                pixels[i*stride_in_bytes] = (unsigned char) (total / (unsigned int)kernel_width);
            }
            break;
        }

        for (; i < h; ++i) {
            NK_ASSERT(pixels[i*stride_in_bytes] == 0);
            total -= (unsigned int)(buffer[i & NK_TT__OVER_MASK]);
            pixels[i*stride_in_bytes] = (unsigned char) (total / (unsigned int)kernel_width);
        }
        pixels += 1;
    }
}